

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetamlevlat.cpp
# Opt level: O0

uchar __thiscall
EnvironmentNAVXYTHETAMLEVLAT::GetMapCost(EnvironmentNAVXYTHETAMLEVLAT *this,int X,int Y)

{
  uchar local_21;
  int levind;
  uchar mapcost;
  int Y_local;
  int X_local;
  EnvironmentNAVXYTHETAMLEVLAT *this_local;
  
  mapcost = (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
            EnvNAVXYTHETALATCfg.Grid2D[X][Y];
  for (levind = 0; levind < this->numofadditionalzlevs; levind = levind + 1) {
    if (this->AddLevelGrid2D[levind][X][Y] < mapcost) {
      local_21 = mapcost;
    }
    else {
      local_21 = this->AddLevelGrid2D[levind][X][Y];
    }
    mapcost = local_21;
  }
  return mapcost;
}

Assistant:

unsigned char EnvironmentNAVXYTHETAMLEVLAT::GetMapCost(int X, int Y)
{
    unsigned char mapcost = EnvNAVXYTHETALATCfg.Grid2D[X][Y];

    for (int levind = 0; levind < numofadditionalzlevs; levind++) {
        mapcost = __max(mapcost, AddLevelGrid2D[levind][X][Y]);
    }

    return mapcost;
}